

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>>,Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>,Eigen::internal::assign_op<std::complex<float>,std::complex<float>>>
               (Matrix<std::complex<float>,__1,_1,_0,__1,_1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>_>,_Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>
               *src,assign_op<std::complex<float>,_std::complex<float>_> *func)

{
  ActualDstType actualDst;
  assign_op<std::complex<float>,_std::complex<float>_> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>_>,_Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>
  *src_local;
  Matrix<std::complex<float>,__1,_1,_0,__1,_1> *dst_local;
  
  Assignment<Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<float>_>,_Eigen::Matrix<std::complex<float>,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<std::complex<float>,_std::complex<float>_>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}